

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnNeutralize
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,string_view building,
          TeamType *oldTeam)

{
  bool bVar1;
  __sv_type _Var2;
  undefined1 auVar3 [16];
  code *local_178;
  size_t local_118;
  char *local_110;
  size_t local_f8;
  char *local_f0;
  size_t local_d8;
  char *local_d0;
  size_t local_b8;
  char *local_b0;
  size_t local_88;
  char *local_80;
  undefined1 local_68 [8];
  string msg;
  logFuncType func;
  TeamType *oldTeam_local;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  string_view building_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x1d & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_68,&this->neutralizeFmt);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  if (!bVar1) {
    RenX::processTags((string *)local_68,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(RenX::tags + 0x14e8));
    auVar3 = RenX::translateName(building._M_len,building._M_str);
    local_88 = _Var2._M_len;
    local_80 = _Var2._M_str;
    RenX::replace_tag(local_68,local_88,local_80,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0xa08))
    ;
    auVar3 = RenX::getTeamColor(*oldTeam);
    local_b8 = _Var2._M_len;
    local_b0 = _Var2._M_str;
    RenX::replace_tag(local_68,local_b8,local_b0,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0xa28))
    ;
    auVar3 = RenX::getTeamName(*oldTeam);
    local_d8 = _Var2._M_len;
    local_d0 = _Var2._M_str;
    RenX::replace_tag(local_68,local_d8,local_d0,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0xa48))
    ;
    auVar3 = RenX::getFullTeamName(*oldTeam);
    local_f8 = _Var2._M_len;
    local_f0 = _Var2._M_str;
    RenX::replace_tag(local_68,local_f8,local_f0,auVar3._0_8_,auVar3._8_8_);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_178 = (code *)msg.field_2._8_8_;
    }
    else {
      local_178 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    local_118 = _Var2._M_len;
    local_110 = _Var2._M_str;
    (*local_178)(server,local_118,local_110);
  }
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnNeutralize(RenX::Server &server, const RenX::PlayerInfo &player, std::string_view building, const RenX::TeamType &oldTeam)
{
	logFuncType func;
	if (RenX_LoggingPlugin::neutralizePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->neutralizeFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, RenX::translateName(building));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(oldTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(oldTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(oldTeam));
		(server.*func)(msg);
	}
}